

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O0

int ncnn::convolution_im2col_gemm_int8
              (Mat *bottom_blob,Mat *top_blob,Mat *AT,int kernel_w,int kernel_h,int dilation_w,
              int dilation_h,int stride_w,int stride_h,int nT,Option *opt)

{
  int *piVar1;
  int in_ECX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000018;
  long in_stack_00000028;
  Mat BT_tile_1;
  Mat AT_tile;
  int max_kk_1;
  int k_1;
  int max_jj_1;
  int j_1;
  Mat topT_tile;
  int max_ii;
  int i;
  int ppj_1;
  Mat topT;
  Mat BT_tile;
  int max_kk;
  int max_jj;
  int k;
  int j;
  int ppk;
  int ppj;
  int ppjk;
  int nn_NK;
  Mat BT;
  int nn_K;
  int nn_N;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int N;
  int M;
  int maxk;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_2;
  undefined4 in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  int in_stack_fffffffffffff5e4;
  int in_stack_fffffffffffff5e8;
  int in_stack_fffffffffffff5ec;
  Mat *in_stack_fffffffffffff5f0;
  Mat *in_stack_fffffffffffff5f8;
  void **ppvVar2;
  undefined8 *puVar3;
  undefined4 in_stack_fffffffffffff610;
  undefined4 in_stack_fffffffffffff614;
  int *in_stack_fffffffffffff618;
  int in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff624;
  int in_stack_fffffffffffff628;
  int in_stack_fffffffffffff62c;
  undefined8 in_stack_fffffffffffff630;
  undefined8 in_stack_fffffffffffff638;
  undefined8 in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  bool local_8e1;
  void *__ptr;
  undefined8 local_708;
  undefined8 local_700;
  undefined8 local_6f8;
  undefined4 local_6f0;
  long *local_6e8;
  undefined4 local_6e0;
  undefined4 local_6dc;
  undefined4 local_6d8;
  undefined4 local_6d4;
  undefined4 local_6d0;
  undefined8 local_6c8;
  void *local_6c0;
  int *local_6b8;
  long local_6b0;
  undefined4 local_6a8;
  long *local_6a0;
  undefined4 local_698;
  int local_694;
  undefined4 local_690;
  undefined4 local_68c;
  undefined4 local_688;
  long local_680;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  int local_668;
  int local_664;
  int local_660;
  int local_65c;
  int local_658;
  int local_654;
  undefined4 local_650;
  void *local_640;
  int *local_638;
  long local_630;
  undefined4 local_628;
  long *local_620;
  undefined4 local_618;
  int local_614;
  int local_610;
  undefined4 local_60c;
  int local_608;
  long local_600;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  int local_5d0;
  int local_5a4;
  undefined8 *local_5a0;
  void **local_590;
  undefined8 *local_530;
  void **local_520;
  int local_500;
  undefined4 local_4fc;
  void **local_4f8;
  int local_4e0;
  undefined4 local_4dc;
  undefined8 *local_4d8;
  int local_420;
  undefined4 local_41c;
  void **local_418;
  undefined8 *local_3f8;
  undefined1 *local_3f0;
  void **local_3e8;
  undefined1 local_37d;
  int local_37c;
  void **local_378;
  undefined8 *local_370;
  void *local_2f0;
  void *local_280;
  undefined8 local_270;
  undefined8 local_268;
  int local_25c;
  int local_258;
  int local_254;
  void **local_250;
  undefined8 local_248;
  undefined8 local_240;
  undefined4 local_230;
  int local_22c;
  undefined1 *local_228;
  undefined4 local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  void **local_1c8;
  long *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  void *local_1a8;
  undefined4 local_1a0;
  int local_19c;
  void **local_198;
  void **local_190;
  undefined1 *local_188;
  long *local_100;
  undefined4 local_f4;
  long local_f0;
  void *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  undefined8 *local_d0;
  undefined4 local_34;
  long local_30;
  
  local_5d0 = in_ECX * in_R8D;
  local_5d4 = *(int *)(in_RSI + 0x38) * *(int *)(in_RSI + 0x18);
  local_5d8 = *(int *)(in_RSI + 0x2c) * *(int *)(in_RSI + 0x30);
  local_5dc = *(int *)(in_RDI + 0x38) * *(int *)(in_RDI + 0x18) * local_5d0;
  convolution_im2col_gemm_get_optimal_tile_mnk_int8
            ((int)((ulong)in_stack_fffffffffffff630 >> 0x20),(int)in_stack_fffffffffffff630,
             in_stack_fffffffffffff62c,
             (int *)CONCAT44(in_stack_fffffffffffff624,in_stack_fffffffffffff620),
             in_stack_fffffffffffff618,
             (int *)CONCAT44(in_stack_fffffffffffff614,in_stack_fffffffffffff610),
             (int)in_stack_fffffffffffff640);
  local_5ec = (local_5d4 + local_5e0 + -1) / local_5e0;
  local_5f0 = (local_5d8 + local_5e4 + -1) / local_5e4;
  local_5f4 = (local_5dc + local_5e8 + -1) / local_5e8;
  local_254 = local_5e8 * local_5e4;
  local_258 = (local_5dc + local_5e8 + -1) / local_5e8;
  local_25c = (local_5d8 + local_5e4 + -1) / local_5e4;
  local_270 = *(undefined8 *)(in_stack_00000028 + 0x10);
  local_250 = &local_640;
  local_268 = 1;
  local_640 = (void *)0x0;
  local_638 = (int *)0x0;
  local_630 = 0;
  local_628 = 0;
  local_620 = (long *)0x0;
  local_618 = 0;
  local_614 = 0;
  local_610 = 0;
  local_60c = 0;
  local_608 = 0;
  local_600 = 0;
  Mat::create(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8,
              in_stack_fffffffffffff5e4,
              CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
              (Allocator *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
  local_3e8 = &local_640;
  if (local_640 != (void *)0x0) {
    local_190 = local_3e8;
  }
  local_8e1 = local_640 != (void *)0x0 && local_600 * local_608 != 0;
  if (local_8e1) {
    local_654 = local_5f0 * local_5f4;
    for (local_658 = 0; local_658 < local_654; local_658 = local_658 + 1) {
      local_65c = local_658 / local_5f4;
      local_660 = local_658 % local_5f4;
      local_664 = local_65c * local_5e4;
      local_668 = local_660 * local_5e8;
      local_670 = local_5d8 - local_664;
      piVar1 = std::min<int>(&local_670,&local_5e4);
      local_66c = *piVar1;
      local_678 = local_5dc - local_668;
      piVar1 = std::min<int>(&local_678,&local_5e8);
      local_674 = *piVar1;
      local_37c = local_664 / local_5e4;
      local_370 = &local_708;
      local_378 = &local_640;
      local_e8 = (void *)((long)local_640 + local_600 * local_37c * local_630);
      local_d0 = &local_708;
      local_30 = (long)local_614 * (long)local_610 * local_630;
      local_1d4 = local_668 / local_5e8;
      local_1c8 = &local_6c0;
      local_1d0 = &local_708;
      local_1a8 = (void *)((long)local_e8 + (long)local_614 * (long)local_1d4 * local_630);
      local_198 = &local_6c0;
      local_680 = (long)local_614;
      local_5a0 = &local_708;
      local_688 = 1;
      local_68c = 1;
      local_690 = 1;
      local_694 = local_614;
      local_698 = 2;
      local_6a0 = local_620;
      local_6a8 = local_628;
      local_6b0 = local_630;
      local_6b8 = (int *)0x0;
      local_6e8 = local_620;
      local_34 = 0x10;
      local_d4 = local_614;
      local_d8 = local_610;
      local_dc = local_60c;
      local_f0 = local_630;
      local_f4 = local_628;
      local_100 = local_620;
      local_19c = local_614;
      local_1a0 = 1;
      local_1b0 = local_630;
      local_1b4 = local_628;
      local_1c0 = local_620;
      local_1d8 = 1;
      local_37d = 1;
      local_708 = 0;
      local_6f8 = 0;
      local_6f0 = 0;
      local_6e0 = 0;
      local_6dc = 0;
      local_6d8 = 0;
      local_6d4 = 0;
      local_6d0 = 0;
      local_6c8 = 0;
      local_700 = 0;
      in_stack_fffffffffffff5d0 = in_stack_00000008;
      in_stack_fffffffffffff5d8 = in_stack_00000010;
      local_3f8 = local_5a0;
      local_6c0 = local_1a8;
      convolution_im2col_input_tile_int8
                (in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec,
                 in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e4,in_stack_00000018,
                 in_stack_fffffffffffff620,in_stack_fffffffffffff628,(int)in_stack_fffffffffffff630,
                 (int)in_stack_fffffffffffff638,(int)in_stack_fffffffffffff640,
                 (int)in_stack_fffffffffffff648);
      local_590 = &local_6c0;
      local_418 = local_590;
      if (local_6b8 != (int *)0x0) {
        local_41c = 0xffffffff;
        LOCK();
        local_420 = *local_6b8;
        *local_6b8 = *local_6b8 + -1;
        UNLOCK();
        if (local_420 == 1) {
          if (local_6a0 == (long *)0x0) {
            local_2f0 = local_6c0;
            if (local_6c0 != (void *)0x0) {
              free(local_6c0);
            }
          }
          else {
            (**(code **)(*local_6a0 + 0x18))(local_6a0,local_6c0);
          }
        }
      }
      local_6c0 = (void *)0x0;
      local_6b0 = 0;
      local_6a8 = 0;
      local_698 = 0;
      local_694 = 0;
      local_690 = 0;
      local_68c = 0;
      local_688 = 0;
      local_680 = 0;
      local_6b8 = (int *)0x0;
    }
    local_22c = local_5e4 * local_5e0;
    local_248 = *(undefined8 *)(in_stack_00000028 + 0x10);
    local_228 = &stack0xfffffffffffff8b0;
    local_230 = 1;
    local_240 = 4;
    __ptr = (void *)0x0;
    piVar1 = (int *)0x0;
    Mat::create(in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8,
                in_stack_fffffffffffff5e4,
                CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                (Allocator *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0));
    local_3f0 = &stack0xfffffffffffff8b0;
    if (__ptr != (void *)0x0) {
      local_188 = local_3f0;
    }
    local_5a4 = -100;
    local_650 = 1;
    puVar3 = (undefined8 *)&stack0xfffffffffffff8b0;
    local_530 = puVar3;
    local_4d8 = puVar3;
    if (piVar1 != (int *)0x0) {
      local_4dc = 0xffffffff;
      LOCK();
      local_4e0 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((local_4e0 == 1) && (__ptr != (void *)0x0)) {
        free(__ptr);
      }
    }
    *puVar3 = 0;
    puVar3[2] = 0;
    *(undefined4 *)(puVar3 + 3) = 0;
    *(undefined4 *)(puVar3 + 5) = 0;
    *(undefined4 *)((long)puVar3 + 0x2c) = 0;
    *(undefined4 *)(puVar3 + 6) = 0;
    *(undefined4 *)((long)puVar3 + 0x34) = 0;
    *(undefined4 *)(puVar3 + 7) = 0;
    puVar3[8] = 0;
    puVar3[1] = 0;
  }
  else {
    local_5a4 = -100;
    local_650 = 1;
  }
  ppvVar2 = &local_640;
  if (local_638 != (int *)0x0) {
    local_4fc = 0xffffffff;
    LOCK();
    local_500 = *local_638;
    *local_638 = *local_638 + -1;
    UNLOCK();
    if (local_500 == 1) {
      local_520 = ppvVar2;
      local_4f8 = ppvVar2;
      if (local_620 == (long *)0x0) {
        local_280 = local_640;
        if (local_640 != (void *)0x0) {
          free(local_640);
        }
      }
      else {
        (**(code **)(*local_620 + 0x18))(local_620,local_640);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_5a4;
}

Assistant:

static int convolution_im2col_gemm_int8(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int nT, const Option& opt)
{
    const int maxk = kernel_w * kernel_h;

    const int M = top_blob.c * top_blob.elempack;
    const int N = top_blob.w * top_blob.h;
    const int K = bottom_blob.c * bottom_blob.elempack * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 1u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    #pragma omp parallel for num_threads(nT)
    for (int ppjk = 0; ppjk < nn_NK; ppjk++)
    {
        const int ppj = ppjk / nn_K;
        const int ppk = ppjk % nn_K;

        const int j = ppj * TILE_N;
        const int k = ppk * TILE_K;

        const int max_jj = std::min((N - j), TILE_N);
        const int max_kk = std::min((K - k), TILE_K);

        Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

        // im2col
        convolution_im2col_input_tile_int8(bottom_blob, BT_tile, j, max_jj, k, max_kk, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h);
    }

    Mat topT(TILE_N * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (topT.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        Mat topT_tile = topT.channel(get_omp_thread_num());

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

                const Mat BT_tile = BT.channel(j / TILE_N).row_range(k / TILE_K, 1);

                convolution_gemm_transB_packed_tile_int8(AT_tile, BT_tile, topT_tile, i, max_ii, j, max_jj, k, max_kk);
            }

            unpack_output_tile_int32(topT_tile, top_blob, i, max_ii, j, max_jj);
        }
    }

    return 0;
}